

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Snes_Spc.cpp
# Opt level: O0

blargg_err_t __thiscall Snes_Spc::load_spc(Snes_Spc *this,void *data,long size)

{
  int iVar1;
  Snes_Spc *in_RDX;
  uint8_t *in_RSI;
  Snes_Spc *in_RDI;
  spc_file_t *spc;
  
  if ((0x22 < (long)in_RDX) &&
     (iVar1 = memcmp(in_RSI,"SNES-SPC700 Sound File Data v0.30\x1a\x1a",0x1b), iVar1 == 0)) {
    if ((long)in_RDX < 0x10180) {
      return "Corrupt SPC file";
    }
    (in_RDI->m).cpu_regs.pc = (uint)in_RSI[0x26] * 0x100 + (uint)in_RSI[0x25];
    (in_RDI->m).cpu_regs.a = (uint)in_RSI[0x27];
    (in_RDI->m).cpu_regs.x = (uint)in_RSI[0x28];
    (in_RDI->m).cpu_regs.y = (uint)in_RSI[0x29];
    (in_RDI->m).cpu_regs.psw = (uint)in_RSI[0x2a];
    (in_RDI->m).cpu_regs.sp = (uint)in_RSI[0x2b];
    memcpy((in_RDI->m).ram.ram,in_RSI + 0x100,0x10000);
    ram_loaded(in_RDI);
    Spc_Dsp::load(&in_RDX->dsp,in_RSI);
    reset_time_regs(in_RDX);
    return (blargg_err_t)0x0;
  }
  return "Not an SPC file";
}

Assistant:

blargg_err_t Snes_Spc::load_spc( void const* data, long size )
{
	spc_file_t const* const spc = (spc_file_t const*) data;
	
	// be sure compiler didn't insert any padding into fle_t
	assert( sizeof (spc_file_t) == spc_min_file_size + 0x80 );
	
	// Check signature and file size
	if ( size < signature_size || memcmp( spc, signature, 27 ) )
		return "Not an SPC file";
	
	if ( size < spc_min_file_size )
		return "Corrupt SPC file";
	
	// CPU registers
	m.cpu_regs.pc  = spc->pch * 0x100 + spc->pcl;
	m.cpu_regs.a   = spc->a;
	m.cpu_regs.x   = spc->x;
	m.cpu_regs.y   = spc->y;
	m.cpu_regs.psw = spc->psw;
	m.cpu_regs.sp  = spc->sp;
	
	// RAM and registers
	memcpy( RAM, spc->ram, 0x10000 );
	ram_loaded();
	
	// DSP registers
	dsp.load( spc->dsp );
	
	reset_time_regs();
	
	return 0;
}